

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void send_ssi_file(mg_connection *conn,char *path,FILE *fp,int include_level)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  int local_2034;
  int in_ssi_tag;
  int len;
  int offset;
  int ch;
  char buf [8192];
  int include_level_local;
  FILE *fp_local;
  char *path_local;
  mg_connection *conn_local;
  
  buf._8188_4_ = include_level;
  if (include_level < 0xb) {
    local_2034 = 0;
    bVar1 = false;
    while (iVar3 = fgetc((FILE *)fp), iVar3 != -1) {
      uVar2 = (undefined1)iVar3;
      if ((bVar1) && (iVar3 == 0x3e)) {
        bVar1 = false;
        iVar3 = local_2034 + 1;
        *(undefined1 *)((long)&offset + (long)local_2034) = uVar2;
        *(undefined1 *)((long)&offset + (long)iVar3) = 0;
        if (0x2000 < iVar3) {
          __assert_fail("len <= (int) sizeof(buf)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ProjetoHotSpot[P]UaiFai/lib/mongoose.c"
                        ,0x105b,
                        "void send_ssi_file(struct mg_connection *, const char *, FILE *, int)");
        }
        if ((iVar3 < 6) || (iVar4 = memcmp(&offset,"<!--#",5), iVar4 != 0)) {
          mg_write(conn,&offset,iVar3);
        }
        else {
          iVar3 = memcmp((void *)((long)&ch + 1),"include",7);
          if (iVar3 == 0) {
            do_ssi_include(conn,path,buf + 4,buf._8188_4_);
          }
          else if (stack0xffffffffffffdfdd == 0x63657865) {
            do_ssi_exec(conn,buf + 1);
          }
          else {
            mg_printf(conn,"%s: unknown SSI command: \"%s\"",path,&offset);
          }
        }
        local_2034 = 0;
      }
      else if (bVar1) {
        if ((local_2034 == 5) && (iVar3 = memcmp(&offset,"<!--#",5), iVar3 != 0)) {
          bVar1 = false;
        }
        else if (local_2034 == 0x1ffe) {
          mg_printf(conn,"%s: SSI tag is too large",path);
          local_2034 = 0;
        }
        *(undefined1 *)((long)&offset + (long)local_2034) = uVar2;
        local_2034 = local_2034 + 1;
      }
      else if (iVar3 == 0x3c) {
        bVar1 = true;
        if (0 < local_2034) {
          mg_write(conn,&offset,local_2034);
        }
        local_2034 = 1;
        offset._0_1_ = uVar2;
      }
      else {
        iVar3 = local_2034 + 1;
        *(undefined1 *)((long)&offset + (long)local_2034) = uVar2;
        local_2034 = iVar3;
        if (iVar3 == 0x2000) {
          mg_write(conn,&offset,0x2000);
          local_2034 = 0;
        }
      }
    }
    if (0 < local_2034) {
      mg_write(conn,&offset,local_2034);
    }
  }
  else {
    mg_printf(conn,"SSI #include level is too deep (%s)",path);
  }
  return;
}

Assistant:

static void send_ssi_file(struct mg_connection *conn, const char *path,
                          FILE *fp, int include_level) {
  char buf[IOBUF_SIZE];
  int ch, offset, len, in_ssi_tag;

  if (include_level > 10) {
    mg_printf(conn, "SSI #include level is too deep (%s)", path);
    return;
  }

  in_ssi_tag = len = offset = 0;
  while ((ch = fgetc(fp)) != EOF) {
    if (in_ssi_tag && ch == '>') {
      in_ssi_tag = 0;
      buf[len++] = (char) ch;
      buf[len] = '\0';
      assert(len <= (int) sizeof(buf));
      if (len < 6 || memcmp(buf, "<!--#", 5) != 0) {
        // Not an SSI tag, pass it
        (void) mg_write(conn, buf, (size_t) len);
      } else {
        if (!memcmp(buf + 5, "include", 7)) {
          do_ssi_include(conn, path, buf + 12, include_level);
#if !defined(MONGOOSE_NO_POPEN)
        } else if (!memcmp(buf + 5, "exec", 4)) {
          do_ssi_exec(conn, buf + 9);
#endif // !NO_POPEN
        } else {
          mg_printf(conn, "%s: unknown SSI " "command: \"%s\"", path, buf);
        }
      }
      len = 0;
    } else if (in_ssi_tag) {
      if (len == 5 && memcmp(buf, "<!--#", 5) != 0) {
        // Not an SSI tag
        in_ssi_tag = 0;
      } else if (len == (int) sizeof(buf) - 2) {
        mg_printf(conn, "%s: SSI tag is too large", path);
        len = 0;
      }
      buf[len++] = ch & 0xff;
    } else if (ch == '<') {
      in_ssi_tag = 1;
      if (len > 0) {
        mg_write(conn, buf, (size_t) len);
      }
      len = 0;
      buf[len++] = ch & 0xff;
    } else {
      buf[len++] = ch & 0xff;
      if (len == (int) sizeof(buf)) {
        mg_write(conn, buf, (size_t) len);
        len = 0;
      }
    }
  }

  // Send the rest of buffered data
  if (len > 0) {
    mg_write(conn, buf, (size_t) len);
  }
}